

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.hpp
# Opt level: O2

ByteArray * __thiscall
ColorPalette<6UL>::to_bytes(ByteArray *__return_storage_ptr__,ColorPalette<6UL> *this)

{
  uint16_t word;
  long lVar1;
  
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0x18; lVar1 = lVar1 + 4) {
    word = Color::to_bgr_word((Color *)(&(this->super_array<Color,_6UL>)._M_elems[0]._r + lVar1));
    ByteArray::add_word(__return_storage_ptr__,word);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] ByteArray to_bytes() const
    {
        ByteArray bytes;
        for(const Color& color : *this)
            bytes.add_word(color.to_bgr_word());
        return bytes;
    }